

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O2

void cf_hmac_finish(cf_hmac_ctx *ctx,uint8_t *out)

{
  uint8_t innerh [64];
  uint8_t auStack_68 [72];
  
  if (((ctx != (cf_hmac_ctx *)0x0) && (ctx->hash != (cf_chash *)0x0)) && (out != (uint8_t *)0x0)) {
    (*ctx->hash->digest)(&ctx->inner,auStack_68);
    (*ctx->hash->update)(&ctx->outer,auStack_68,ctx->hash->hashsz);
    (*ctx->hash->digest)(&ctx->outer,out);
    memset(ctx,0,0x2d8);
    return;
  }
  abort();
}

Assistant:

void cf_hmac_finish(cf_hmac_ctx *ctx, uint8_t *out)
{
  assert(ctx && ctx->hash);
  assert(out);

  uint8_t innerh[CF_MAXHASH];
  ctx->hash->digest(&ctx->inner, innerh);

  ctx->hash->update(&ctx->outer, innerh, ctx->hash->hashsz);
  ctx->hash->digest(&ctx->outer, out);

  mem_clean(ctx, sizeof *ctx);
}